

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessGetTimeoutLeft
              (kwsysProcessTime *timeoutTime,double *userTimeout,
              kwsysProcessTimeNative *timeoutLength,int zeroIsExpired)

{
  kwsysProcessTime in2;
  undefined1 local_50 [8];
  kwsysProcessTime timeLeft;
  kwsysProcessTime currentTime;
  int zeroIsExpired_local;
  kwsysProcessTimeNative *timeoutLength_local;
  double *userTimeout_local;
  kwsysProcessTime *timeoutTime_local;
  
  if (timeoutTime->tv_sec < 0) {
    timeoutTime_local._4_4_ = 0;
  }
  else {
    in2 = kwsysProcessTimeGetCurrent();
    _local_50 = kwsysProcessTimeSubtract(*timeoutTime,in2);
    if ((((long)local_50 < 0) && (userTimeout != (double *)0x0)) && (*userTimeout <= 0.0)) {
      _local_50 = (kwsysProcessTime)ZEXT816(0);
    }
    if (((long)local_50 < 0) ||
       (((local_50 == (undefined1  [8])0x0 && (timeLeft.tv_sec == 0)) && (zeroIsExpired != 0)))) {
      timeoutTime_local._4_4_ = 1;
    }
    else {
      timeoutLength->tv_sec = (__time_t)local_50;
      timeoutLength->tv_usec = timeLeft.tv_sec;
      timeoutTime_local._4_4_ = 0;
    }
  }
  return timeoutTime_local._4_4_;
}

Assistant:

static int kwsysProcessGetTimeoutLeft(kwsysProcessTime* timeoutTime,
                                      double* userTimeout,
                                      kwsysProcessTimeNative* timeoutLength,
                                      int zeroIsExpired)
{
  if (timeoutTime->tv_sec < 0) {
    /* No timeout time has been requested.  */
    return 0;
  } else {
    /* Calculate the remaining time.  */
    kwsysProcessTime currentTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime timeLeft =
      kwsysProcessTimeSubtract(*timeoutTime, currentTime);
    if (timeLeft.tv_sec < 0 && userTimeout && *userTimeout <= 0) {
      /* Caller has explicitly requested a zero timeout.  */
      timeLeft.tv_sec = 0;
      timeLeft.tv_usec = 0;
    }

    if (timeLeft.tv_sec < 0 ||
        (timeLeft.tv_sec == 0 && timeLeft.tv_usec == 0 && zeroIsExpired)) {
      /* Timeout has already expired.  */
      return 1;
    } else {
      /* There is some time left.  */
      timeoutLength->tv_sec = timeLeft.tv_sec;
      timeoutLength->tv_usec = timeLeft.tv_usec;
      return 0;
    }
  }
}